

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_set_svc_frame_drop_mode(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AOM_SVC_FRAME_DROP_MODE AVar2;
  AV1_COMP *pAVar3;
  AOM_SVC_FRAME_DROP_MODE *pAVar4;
  
  pAVar3 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    pAVar4 = (AOM_SVC_FRAME_DROP_MODE *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    pAVar4 = (AOM_SVC_FRAME_DROP_MODE *)args->overflow_arg_area;
    args->overflow_arg_area = pAVar4 + 2;
  }
  AVar2 = *pAVar4;
  (pAVar3->svc).framedrop_mode = AVar2;
  return (uint)(AOM_FULL_SUPERFRAME_DROP < AVar2) << 3;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_frame_drop_mode(aom_codec_alg_priv_t *ctx,
                                                    va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  cpi->svc.framedrop_mode = CAST(AV1E_SET_SVC_FRAME_DROP_MODE, args);
  if (cpi->svc.framedrop_mode != AOM_LAYER_DROP &&
      cpi->svc.framedrop_mode != AOM_FULL_SUPERFRAME_DROP)
    return AOM_CODEC_INVALID_PARAM;
  else
    return AOM_CODEC_OK;
}